

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplerng.c
# Opt level: O1

int simplerng_poisson_small(double lambda)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = exp(-lambda);
  dVar4 = 1.0;
  iVar2 = -1;
  do {
    iVar1 = rand();
    dVar4 = dVar4 * (double)iVar1 * 4.656612873077393e-10;
    iVar2 = iVar2 + 1;
  } while (dVar3 < dVar4);
  return iVar2;
}

Assistant:

int simplerng_poisson_small(double lambda)
{
  /* Algorithm due to Donald Knuth, 1969. */
  double p = 1.0, L = exp(-lambda);
  int k = 0;
  do {
    k++;
    p *= simplerng_getuniform();
  }
  while (p > L);
  return k - 1;
}